

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O2

Dictionary * __thiscall FIX::SessionSettings::get(SessionSettings *this,SessionID *sessionID)

{
  const_iterator cVar1;
  ConfigError *this_00;
  allocator<char> local_39;
  string local_38;
  
  cVar1 = std::
          _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
          ::find((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                  *)this,sessionID);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_settings)._M_t._M_impl.super__Rb_tree_header) {
    return (Dictionary *)&cVar1._M_node[0xb]._M_left;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Session not found",&local_39);
  ConfigError::ConfigError(this_00,&local_38);
  __cxa_throw(this_00,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  Dictionaries::const_iterator i;
  i = m_settings.find(sessionID);
  if (i == m_settings.end()) {
    throw ConfigError("Session not found");
  }
  return i->second;
}